

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

void * Curl_ssl_get_internals(Curl_easy *data,int sockindex,CURLINFO info,int n)

{
  Curl_cfilter *pCVar1;
  ssl_connect_data *psVar2;
  Curl_easy *pCVar3;
  void *pvVar4;
  
  if (data->conn != (connectdata *)0x0) {
    for (pCVar1 = data->conn->cfilter[sockindex]; pCVar1 != (Curl_cfilter *)0x0;
        pCVar1 = pCVar1->next) {
      if ((pCVar1->cft == &Curl_cft_ssl) || (pCVar1->cft == &Curl_cft_ssl_proxy)) {
        psVar2 = (ssl_connect_data *)pCVar1->ctx;
        pCVar3 = (psVar2->call_data).data;
        (psVar2->call_data).data = data;
        pvVar4 = (*Curl_ssl->get_internals)(psVar2,info);
        *(Curl_easy **)((long)pCVar1->ctx + 0x38) = pCVar3;
        return pvVar4;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *Curl_ssl_get_internals(struct Curl_easy *data, int sockindex,
                             CURLINFO info, int n)
{
  void *result = NULL;
  (void)n;
  if(data->conn) {
    struct Curl_cfilter *cf;
    /* get first SSL filter in chain, if any is present */
    cf = get_ssl_filter(data->conn->cfilter[sockindex]);
    if(cf) {
      struct cf_call_data save;
      CF_DATA_SAVE(save, cf, data);
      result = Curl_ssl->get_internals(cf->ctx, info);
      CF_DATA_RESTORE(cf, save);
    }
  }
  return result;
}